

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_opt.hpp
# Opt level: O3

shared_handle * __thiscall
gmlc::libguarded::
shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
::lock(shared_handle *__return_storage_ptr__,
      shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
      *this)

{
  bool bVar1;
  unique_lock<std::mutex> local_18;
  
  bVar1 = this->enabled;
  __return_storage_ptr__->data = &this->m_obj;
  if (bVar1 == true) {
    (__return_storage_ptr__->m_handle_lock)._M_device = &this->m_mutex;
    (__return_storage_ptr__->m_handle_lock)._M_owns = false;
    std::unique_lock<std::mutex>::lock(&__return_storage_ptr__->m_handle_lock);
    (__return_storage_ptr__->m_handle_lock)._M_owns = true;
  }
  else {
    (__return_storage_ptr__->m_handle_lock)._M_device = (mutex_type *)0x0;
    (__return_storage_ptr__->m_handle_lock)._M_owns = false;
    local_18._M_device = (mutex_type *)0x0;
    local_18._M_owns = false;
    std::unique_lock<std::mutex>::~unique_lock(&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

auto shared_guarded_opt<T, M>::lock() const -> shared_handle
{
    return (enabled) ?
        shared_handle(&m_obj, m_mutex) :
        shared_handle(&m_obj, typename shared_locker<M>::locker_type{});
}